

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkDataTypes.cpp
# Opt level: O1

bool __thiscall TrodesConfig::isValid(TrodesConfig *this)

{
  pointer pNVar1;
  bool bVar2;
  undefined1 extraout_AL;
  pointer *ppiVar3;
  uint uVar4;
  value_type *pvVar5;
  value_type *__x;
  pointer pNVar6;
  char *pcVar7;
  ulong uVar8;
  long lVar9;
  bool bVar10;
  
  pNVar6 = (this->devices).super__Vector_base<NDevice,_std::allocator<NDevice>_>._M_impl.
           super__Vector_impl_data._M_start;
  pvVar5 = (value_type *)
           (((long)(this->devices).super__Vector_base<NDevice,_std::allocator<NDevice>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)pNVar6 >> 3) * -0x71c71c71c71c71c7);
  bVar10 = 0 < (int)pvVar5;
  if (0 < (int)pvVar5) {
    lVar9 = 0;
    __x = (value_type *)0x0;
    do {
      if (pvVar5 <= __x) goto LAB_001780fc;
      bVar2 = NDevice::isValid((NDevice *)
                               ((long)&(pNVar6->super_NetworkDataType)._vptr_NetworkDataType + lVar9
                               ));
      if (!bVar2) {
        if (bVar10) {
          return false;
        }
        break;
      }
      __x = (value_type *)((long)&(__x->super_NetworkDataType)._vptr_NetworkDataType + 1);
      pNVar6 = (this->devices).super__Vector_base<NDevice,_std::allocator<NDevice>_>._M_impl.
               super__Vector_impl_data._M_start;
      pvVar5 = (value_type *)
               (((long)(this->devices).super__Vector_base<NDevice,_std::allocator<NDevice>_>._M_impl
                       .super__Vector_impl_data._M_finish - (long)pNVar6 >> 3) * -0x71c71c71c71c71c7
               );
      lVar9 = lVar9 + 0x48;
      bVar10 = (long)__x < (long)(int)pvVar5;
    } while ((long)__x < (long)(int)pvVar5);
  }
  pNVar1 = (this->nTrodes).super__Vector_base<NTrodeObj,_std::allocator<NTrodeObj>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar9 = (long)(this->nTrodes).super__Vector_base<NTrodeObj,_std::allocator<NTrodeObj>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)pNVar1 >> 3;
  __x = (value_type *)(lVar9 * -0x71c71c71c71c71c7);
  uVar4 = (uint)__x;
  bVar10 = (int)uVar4 < 1;
  if (0 < (int)uVar4) {
    ppiVar3 = (pointer *)
              ((long)&(pNVar1->hw_chans).super__Vector_base<int,_std::allocator<int>_>._M_impl + 8);
    uVar8 = 1;
    do {
      if (lVar9 * 0x71c71c71c71c71c7 + uVar8 == 1) {
LAB_001780fc:
        pcVar7 = "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)";
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
        std::vector<NDevice,_std::allocator<NDevice>_>::push_back
                  ((vector<NDevice,_std::allocator<NDevice>_> *)(pcVar7 + 8),__x);
        return (bool)extraout_AL;
      }
      if (ppiVar3[-5] == (pointer)0x0) {
        return bVar10;
      }
      if (((_Vector_impl_data *)(ppiVar3 + -1))->_M_start == *ppiVar3) {
        return bVar10;
      }
      bVar10 = (uVar4 & 0x7fffffff) <= uVar8;
      ppiVar3 = ppiVar3 + 9;
      bVar2 = uVar8 != (uVar4 & 0x7fffffff);
      uVar8 = uVar8 + 1;
    } while (bVar2);
  }
  return bVar10;
}

Assistant:

bool TrodesConfig::isValid() const {
//    std::cerr << "ISVALID check on TrodesConfig() " << this << "\n";
    // if (devices.empty()){ //there must always at least be an MCU
    //     std::cerr << "NO DEVICES\n";
    //     return(false);
    // }

    for (int i = 0; i < (int)devices.size(); i++) {
        if (!devices.at(i).isValid()){ //check that all devices are valid
            return(false);
        }
    }

    for (int i = 0; i < (int)nTrodes.size(); i++) {
        if (!nTrodes.at(i).isValid()){ //check that all added nTrodes are valid
            return(false);
        }
    }
    return(true);
}